

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

int32_t __thiscall
icu_63::NFRule::findTextLenient
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  UErrorCode status;
  int32_t *local_80;
  UnicodeString *local_78;
  UnicodeString temp;
  
  temp.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  status = U_ZERO_ERROR;
  temp.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar4 = -startingAt;
  local_80 = length;
  local_78 = key;
  while( true ) {
    sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (str->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 <= startingAt) break;
    UnicodeString::setTo(&temp,str,startingAt,iVar3 + iVar4);
    iVar2 = prefixLength(this,&temp,local_78,&status);
    if (U_ZERO_ERROR < status) break;
    if (iVar2 != 0) goto LAB_0025171a;
    startingAt = startingAt + 1;
    iVar4 = iVar4 + -1;
  }
  startingAt = -1;
  iVar2 = 0;
LAB_0025171a:
  *local_80 = iVar2;
  UnicodeString::~UnicodeString(&temp);
  return startingAt;
}

Assistant:

int32_t
NFRule::findTextLenient(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    //----------------------------------------------------------------
    // JDK 1.1 HACK (take out of 1.2-specific code)

    // in JDK 1.2, CollationElementIterator provides us with an
    // API to map between character offsets and collation elements
    // and we can do this by marching through the string comparing
    // collation elements.  We can't do that in JDK 1.1.  Insted,
    // we have to go through this horrible slow mess:
    int32_t p = startingAt;
    int32_t keyLen = 0;

    // basically just isolate smaller and smaller substrings of
    // the target string (each running to the end of the string,
    // and with the first one running from startingAt to the end)
    // and then use prefixLength() to see if the search key is at
    // the beginning of each substring.  This is excruciatingly
    // slow, but it will locate the key and tell use how long the
    // matching text was.
    UnicodeString temp;
    UErrorCode status = U_ZERO_ERROR;
    while (p < str.length() && keyLen == 0) {
        temp.setTo(str, p, str.length() - p);
        keyLen = prefixLength(temp, key, status);
        if (U_FAILURE(status)) {
            break;
        }
        if (keyLen != 0) {
            *length = keyLen;
            return p;
        }
        ++p;
    }
    // if we make it to here, we didn't find it.  Return -1 for the
    // location.  The length should be ignored, but set it to 0,
    // which should be "safe"
    *length = 0;
    return -1;
}